

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jumptable.cc
# Opt level: O2

void __thiscall PathMeld::append(PathMeld *this,PathMeld *op2)

{
  pointer ppVVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer ppVVar4;
  ulong uVar5;
  int4 *piVar6;
  
  std::vector<Varnode*,std::allocator<Varnode*>>::
  insert<__gnu_cxx::__normal_iterator<Varnode*const*,std::vector<Varnode*,std::allocator<Varnode*>>>,void>
            ((vector<Varnode*,std::allocator<Varnode*>> *)this,
             (const_iterator)
             (this->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
              )(op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Varnode_*const_*,_std::vector<Varnode_*,_std::allocator<Varnode_*>_>_>
              )(op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
  std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>::
  insert<__gnu_cxx::__normal_iterator<PathMeld::RootedOp_const*,std::vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>>>,void>
            ((vector<PathMeld::RootedOp,std::allocator<PathMeld::RootedOp>> *)&this->opMeld,
             (this->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_start,
             (op2->opMeld).
             super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ppVVar1 = (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar2 = (this->opMeld).
           super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar3 = (this->opMeld).
           super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVVar4 = (op2->commonVn).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = (ulong)(int)((ulong)((long)(op2->opMeld).
                                     super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(op2->opMeld).
                                    super__Vector_base<PathMeld::RootedOp,_std::allocator<PathMeld::RootedOp>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
  piVar6 = &pRVar2[uVar5].rootVn;
  for (; uVar5 < (ulong)((long)pRVar3 - (long)pRVar2 >> 4); uVar5 = uVar5 + 1) {
    *piVar6 = *piVar6 + (int)((ulong)((long)ppVVar1 - (long)ppVVar4) >> 3);
    piVar6 = piVar6 + 4;
  }
  return;
}

Assistant:

void PathMeld::append(const PathMeld &op2)

{
  commonVn.insert(commonVn.begin(),op2.commonVn.begin(),op2.commonVn.end());
  opMeld.insert(opMeld.begin(),op2.opMeld.begin(),op2.opMeld.end());
  // Renumber all the rootVn refs to varnodes we have moved
  for(int4 i=op2.opMeld.size();i<opMeld.size();++i)
    opMeld[i].rootVn += op2.commonVn.size();
}